

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

uint8_t wabt::anon_unknown_1::log2_u32(uint32_t x)

{
  undefined1 local_d;
  undefined4 local_c;
  uint8_t result;
  uint32_t x_local;
  
  local_d = '\0';
  for (local_c = x; 1 < local_c; local_c = local_c >> 1) {
    local_d = local_d + '\x01';
  }
  return local_d;
}

Assistant:

static uint8_t log2_u32(uint32_t x) {
  uint8_t result = 0;
  while (x > 1) {
    x >>= 1;
    result++;
  }
  return result;
}